

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::Type_Conversions::
boxed_type_down_conversion<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const*>
          (Type_Conversions *this,Conversion_Saves *t_saves,Boxed_Value *to)

{
  element_type *peVar1;
  undefined8 in_RCX;
  Type_Info *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Type_Info *in_RSI;
  Type_Conversions *in_RDI;
  Boxed_Value BVar3;
  out_of_range *anon_var_0;
  bad_cast *anon_var_0_1;
  Boxed_Value *ret;
  value_type *in_stack_fffffffffffffef8;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_ffffffffffffff00;
  Type_Conversions *this_00;
  
  this_00 = in_RDI;
  Boxed_Value::get_type_info((Boxed_Value *)0x3e18a6);
  user_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const*>();
  get_conversion(this_00,in_RSI,in_RDX);
  peVar1 = std::
           __shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3e18e8);
  (*peVar1->_vptr_Type_Conversion_Base[1])(in_RDI,peVar1,in_RCX);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr
            ((shared_ptr<chaiscript::detail::Type_Conversion_Base> *)0x3e1910);
  _Var2._M_pi = extraout_RDX;
  if (((ulong)in_RDX->m_type_info & 1) != 0) {
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    _Var2._M_pi = extraout_RDX_00;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)in_RDI;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value boxed_type_down_conversion(Conversion_Saves &t_saves, const Boxed_Value &to) const
        {
          try {
            Boxed_Value ret = get_conversion(to.get_type_info(), user_type<From>())->convert_down(to);
            if (t_saves.enabled) t_saves.saves.push_back(ret);
            return ret;
          } catch (const std::out_of_range &) {
            throw exception::bad_boxed_dynamic_cast(to.get_type_info(), typeid(From), "No known conversion");
          } catch (const std::bad_cast &) {
            throw exception::bad_boxed_dynamic_cast(to.get_type_info(), typeid(From), "Unable to perform dynamic_cast operation");
          }
        }